

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

StridedArrayView1D<const_std::uint32_t> * __thiscall
Corrade::Utility::JsonToken::asUnsignedIntArray
          (StridedArrayView1D<const_std::uint32_t> *__return_storage_ptr__,JsonToken *this,
          size_t expectedSize)

{
  bool bVar1;
  Type TVar2;
  ostream *poVar3;
  Debug *pDVar4;
  ParsedType PVar5;
  size_t size_00;
  char *value;
  StridedArrayView1D<const_Corrade::Utility::JsonToken> local_e8;
  Flags local_c9;
  Error local_c8;
  Flags local_99;
  Error local_98;
  JsonToken *local_70;
  JsonToken *end;
  JsonToken *i;
  size_t size;
  Flags local_41;
  Error local_40;
  JsonToken *local_18;
  size_t expectedSize_local;
  JsonToken *this_local;
  
  local_18 = (JsonToken *)expectedSize;
  expectedSize_local = (size_t)this;
  TVar2 = type(this);
  if (TVar2 == Array) {
    bVar1 = isParsed(this);
    if (bVar1) {
      i = (JsonToken *)(this->field_2)._parsedString;
      size_00 = (long)i * 0x18;
      local_70 = this + (long)((long)&i->_data + 1);
      for (end = this + 1; end != local_70; end = end + 1) {
        PVar5 = parsedType(end);
        size_00 = 0xc00000000000000;
        if (PVar5 != UnsignedInt) {
          poVar3 = Error::defaultOutput();
          Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                    (&local_99);
          Error::Error(&local_98,poVar3,local_99);
          pDVar4 = Debug::operator<<(&local_98.super_Debug,
                                     "Utility::JsonToken::asUnsignedIntArray(): token");
          pDVar4 = Debug::operator<<(pDVar4,((long)end - (long)this >> 3) * -0x5555555555555555 + -1
                                    );
          pDVar4 = Debug::operator<<(pDVar4,"is a");
          TVar2 = type(end);
          pDVar4 = Utility::operator<<(pDVar4,TVar2);
          pDVar4 = Debug::operator<<(pDVar4,"parsed as");
          PVar5 = parsedType(end);
          Utility::operator<<(pDVar4,PVar5);
          Error::~Error(&local_98);
          abort();
        }
      }
      if ((local_18 != (JsonToken *)0x0) && (i != local_18)) {
        poVar3 = Error::defaultOutput();
        Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                  (&local_c9);
        Error::Error(&local_c8,poVar3,local_c9);
        pDVar4 = Debug::operator<<(&local_c8.super_Debug,
                                   "Utility::JsonToken::asUnsignedIntArray(): expected a");
        pDVar4 = Debug::operator<<(pDVar4,(unsigned_long)local_18);
        pDVar4 = Debug::operator<<(pDVar4,Debug::nospace);
        pDVar4 = Debug::operator<<(pDVar4,"-element array, got");
        Debug::operator<<(pDVar4,(unsigned_long)i);
        Error::~Error(&local_c8);
        abort();
      }
      Containers::stridedArrayView<Corrade::Utility::JsonToken_const>
                (&local_e8,(Containers *)(this + 1),i,size_00);
      Containers::StridedArrayView<1U,_const_Corrade::Utility::JsonToken>::
      slice<unsigned_int,_Corrade::Utility::JsonToken,_0>(__return_storage_ptr__,&local_e8,0x10);
      return __return_storage_ptr__;
    }
  }
  poVar3 = Error::defaultOutput();
  Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
  Error::Error(&local_40,poVar3,local_41);
  pDVar4 = Debug::operator<<(&local_40.super_Debug,
                             "Utility::JsonToken::asUnsignedIntArray(): token is");
  bVar1 = isParsed(this);
  value = "an unparsed";
  if (bVar1) {
    value = "a parsed";
  }
  pDVar4 = Debug::operator<<(pDVar4,value);
  TVar2 = type(this);
  Utility::operator<<(pDVar4,TVar2);
  Error::~Error(&local_40);
  abort();
}

Assistant:

Containers::StridedArrayView1D<const std::uint32_t> JsonToken::asUnsignedIntArray(const std::size_t expectedSize) const {
    CORRADE_ASSERT(type() == Type::Array && isParsed(),
        "Utility::JsonToken::asUnsignedIntArray(): token is" << (isParsed() ? "a parsed" : "an unparsed") << type(), {});

    const std::size_t size =
        #ifndef CORRADE_TARGET_32BIT
        _childCount
        #else
        _childCountFlagsTypeNan & ChildCountMask
        #endif
        ;
    #ifndef CORRADE_NO_ASSERT
    /* As this is expected to be a value array, we go by simple incrementing
       instead of with i->next(). If a nested object or array would be
       encountered, the parsedType() check fails. */
    for(const JsonToken *i = this + 1, *end = this + 1 + size; i != end; ++i)
        CORRADE_ASSERT(i->parsedType() == ParsedType::UnsignedInt,
            "Utility::JsonToken::asUnsignedIntArray(): token" << i - this - 1 << "is a" << i->type() << "parsed as" << i->parsedType(), {});
    /* Needs to be after the type-checking loop, otherwise the child count may
       include also nested tokens and the message would be confusing */
    CORRADE_ASSERT(!expectedSize || size == expectedSize,
        "Utility::JsonToken::asUnsignedIntArray(): expected a" << expectedSize << Debug::nospace << "-element array, got" << size, {});
    #else
    static_cast<void>(expectedSize);
    #endif

    return Containers::stridedArrayView(this + 1, size).slice(&JsonToken::_parsedUnsignedInt);
}